

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

bool djgp_to_gl(djg_program *program,int version,bool compatible,bool link,GLuint *gl)

{
  GLboolean GVar1;
  bool bVar2;
  int iVar3;
  int count;
  GLuint program_00;
  GLchar **source;
  char *pcVar4;
  GLchar *__ptr;
  byte bVar5;
  GLchar *logv;
  GLint logc;
  GLint link_status;
  char head_5 [4096];
  char head_4 [4096];
  char head_3 [4096];
  char head_2 [4096];
  char head_1 [4096];
  char head [4096];
  GLuint glprogram;
  int stages;
  int srcc;
  int i;
  djg_program *it;
  GLchar **srcv;
  GLuint *gl_local;
  bool link_local;
  bool compatible_local;
  int version_local;
  djg_program *program_local;
  
  if (program == (djg_program *)0x0 || gl == (GLuint *)0x0) {
    __assert_fail("program && gl",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/dj_opengl/dj_opengl.h"
                  ,0x1f9,"bool djgp_to_gl(const djg_program *, int, bool, bool, GLuint *)");
  }
  iVar3 = djgp__count(program);
  count = iVar3 + 1;
  source = (GLchar **)malloc((long)count << 3);
  _srcc = program->next;
  stages = 1;
  for (; _srcc != (djg_program *)0x0; _srcc = _srcc->next) {
    source[stages] = _srcc->src;
    stages = stages + 1;
  }
  pcVar4 = strstr(source[iVar3],"VERTEX_SHADER");
  bVar5 = pcVar4 != (char *)0x0;
  pcVar4 = strstr(source[iVar3],"FRAGMENT_SHADER");
  if (pcVar4 != (char *)0x0) {
    bVar5 = bVar5 | 2;
  }
  pcVar4 = strstr(source[iVar3],"GEOMETRY_SHADER");
  if (pcVar4 != (char *)0x0) {
    bVar5 = bVar5 | 4;
  }
  pcVar4 = strstr(source[iVar3],"TESS_CONTROL_SHADER");
  if (pcVar4 != (char *)0x0) {
    bVar5 = bVar5 | 8;
  }
  pcVar4 = strstr(source[iVar3],"TESS_EVALUATION_SHADER");
  if (pcVar4 != (char *)0x0) {
    bVar5 = bVar5 | 0x10;
  }
  pcVar4 = strstr(source[iVar3],"COMPUTE_SHADER");
  if (pcVar4 != (char *)0x0) {
    bVar5 = bVar5 | 0x80;
  }
  pcVar4 = strstr(source[iVar3],"TASK_SHADER");
  if (pcVar4 != (char *)0x0) {
    bVar5 = bVar5 | 0x20;
  }
  pcVar4 = strstr(source[iVar3],"MESH_SHADER");
  if (pcVar4 != (char *)0x0) {
    bVar5 = bVar5 | 0x40;
  }
  if (bVar5 == 0) {
    fprintf(_stdout,"djg_error: no shader stage found in source\n");
    fflush(_stdout);
    free(source);
    program_local._7_1_ = false;
  }
  else {
    program_00 = (*glad_glCreateProgram)();
    GVar1 = (*glad_glIsProgram)(program_00);
    if (GVar1 == '\0') {
      fprintf(_stdout,"djg_error: glCreateProgram failed\n");
      fflush(_stdout);
      free(source);
      program_local._7_1_ = false;
    }
    else {
      if ((bVar5 & 1) != 0) {
        head_1[0xff8] = '\0';
        pcVar4 = "";
        if (compatible) {
          pcVar4 = "compatibility";
        }
        sprintf(head_1 + 0xff8,"#version %d %s\n",(ulong)(uint)version,pcVar4);
        strcat(head_1 + 0xff8,"#define VERTEX_SHADER 1\n");
        *source = head_1 + 0xff8;
        bVar2 = djgp__attach_shader(program_00,0x8b31,count,source);
        if (!bVar2) {
          (*glad_glDeleteProgram)(program_00);
          free(source);
          return false;
        }
      }
      if ((bVar5 & 2) != 0) {
        head_2[0xff8] = '\0';
        pcVar4 = "";
        if (compatible) {
          pcVar4 = "compatibility";
        }
        sprintf(head_2 + 0xff8,"#version %d %s\n",(ulong)(uint)version,pcVar4);
        strcat(head_2 + 0xff8,"#define FRAGMENT_SHADER 1\n");
        *source = head_2 + 0xff8;
        bVar2 = djgp__attach_shader(program_00,0x8b30,count,source);
        if (!bVar2) {
          (*glad_glDeleteProgram)(program_00);
          free(source);
          return false;
        }
      }
      if ((bVar5 & 4) != 0) {
        head_3[0xff8] = '\0';
        pcVar4 = "";
        if (compatible) {
          pcVar4 = "compatibility";
        }
        sprintf(head_3 + 0xff8,"#version %d %s\n",(ulong)(uint)version,pcVar4);
        strcat(head_3 + 0xff8,"#define GEOMETRY_SHADER 1\n");
        *source = head_3 + 0xff8;
        bVar2 = djgp__attach_shader(program_00,0x8dd9,count,source);
        if (!bVar2) {
          (*glad_glDeleteProgram)(program_00);
          free(source);
          return false;
        }
      }
      if ((bVar5 & 8) != 0) {
        head_4[0xff8] = '\0';
        pcVar4 = "";
        if (compatible) {
          pcVar4 = "compatibility";
        }
        sprintf(head_4 + 0xff8,"#version %d %s\n",(ulong)(uint)version,pcVar4);
        strcat(head_4 + 0xff8,"#define TESS_CONTROL_SHADER 1\n");
        *source = head_4 + 0xff8;
        bVar2 = djgp__attach_shader(program_00,0x8e88,count,source);
        if (!bVar2) {
          (*glad_glDeleteProgram)(program_00);
          free(source);
          return false;
        }
      }
      if ((bVar5 & 0x10) != 0) {
        head_5[0xff8] = '\0';
        pcVar4 = "";
        if (compatible) {
          pcVar4 = "compatibility";
        }
        sprintf(head_5 + 0xff8,"#version %d %s\n",(ulong)(uint)version,pcVar4);
        strcat(head_5 + 0xff8,"#define TESS_EVALUATION_SHADER 1\n");
        *source = head_5 + 0xff8;
        bVar2 = djgp__attach_shader(program_00,0x8e87,count,source);
        if (!bVar2) {
          (*glad_glDeleteProgram)(program_00);
          free(source);
          return false;
        }
      }
      if ((bVar5 & 0x80) != 0) {
        logc._0_1_ = 0;
        pcVar4 = "";
        if (compatible) {
          pcVar4 = "compatibility";
        }
        sprintf((char *)&logc,"#version %d %s\n",(ulong)(uint)version,pcVar4);
        strcat((char *)&logc,"#define COMPUTE_SHADER 1\n");
        *source = (GLchar *)&logc;
        bVar2 = djgp__attach_shader(program_00,0x91b9,count,source);
        if (!bVar2) {
          (*glad_glDeleteProgram)(program_00);
          free(source);
          return false;
        }
      }
      if (link) {
        logv._4_4_ = 0;
        (*glad_glLinkProgram)(program_00);
        (*glad_glGetProgramiv)(program_00,0x8b82,(GLint *)((long)&logv + 4));
        if (logv._4_4_ == 0) {
          logv._0_4_ = 0;
          (*glad_glGetProgramiv)(program_00,0x8b84,(GLint *)&logv);
          __ptr = (GLchar *)malloc((long)(int)logv);
          (*glad_glGetProgramInfoLog)(program_00,(int)logv,(GLsizei *)0x0,__ptr);
          fprintf(_stdout,
                  "djg_error: GLSL linker failure\n                     -- Begin -- GLSL Linker Info Log\n                     %s\n                     -- End -- GLSL Linker Info Log\n"
                  ,__ptr);
          fflush(_stdout);
          (*glad_glDeleteProgram)(program_00);
          free(__ptr);
          free(source);
          return false;
        }
      }
      free(source);
      GVar1 = (*glad_glIsProgram)(*gl);
      if (GVar1 != '\0') {
        (*glad_glDeleteProgram)(*gl);
      }
      *gl = program_00;
      program_local._7_1_ = true;
    }
  }
  return program_local._7_1_;
}

Assistant:

DJGDEF bool
djgp_to_gl(
    const djg_program *program,
    int version,
    bool compatible,
    bool link,
    GLuint *gl
) {
    const GLchar **srcv;
    djg_program *it;
    int i, srcc, stages = 0;
    GLuint glprogram;

    DJG_ASSERT(program && gl);

    // prepare sources
    srcc = djgp__count(program) + /* head */1;
    srcv = (const GLchar **)DJG_MALLOC(sizeof(GLchar *) * srcc);

    // set source pointers
    it = program->next;
    i = 1;
    while (it) {
        srcv[i] = it->src;
        it = it->next;
        ++i;
    }

    // look for stages in the last source file
    if (strstr(srcv[srcc-1], "VERTEX_SHADER"))
        stages|= DJGP__STAGE_VERTEX_BIT;
    if (strstr(srcv[srcc-1], "FRAGMENT_SHADER"))
        stages|= DJGP__STAGE_FRAGMENT_BIT;
    if (strstr(srcv[srcc-1], "GEOMETRY_SHADER"))
        stages|= DJGP__STAGE_GEOMETRY_BIT;
    if (strstr(srcv[srcc-1], "TESS_CONTROL_SHADER"))
        stages|= DJGP__STAGE_TESS_CONTROL_BIT;
    if (strstr(srcv[srcc-1], "TESS_EVALUATION_SHADER"))
        stages|= DJGP__STAGE_TESS_EVALUATION_BIT;
    if (strstr(srcv[srcc-1], "COMPUTE_SHADER"))
        stages|= DJGP__STAGE_COMPUTE_BIT;
    if (strstr(srcv[srcc-1], "TASK_SHADER"))
        stages|= DJGP__STAGE_TASK_BIT;
    if (strstr(srcv[srcc-1], "MESH_SHADER"))
        stages|= DJGP__STAGE_MESH_BIT;

    if (!stages) {
        DJG_LOG("djg_error: no shader stage found in source\n");
        DJG_FREE(srcv);
        return false;
    }
    // load program
    glprogram = glCreateProgram();
    if (!glIsProgram(glprogram)) {
        DJG_LOG("djg_error: glCreateProgram failed\n");
        DJG_FREE(srcv);
        return false;
    }

#define DJGP__ATTACH_SHADER(glstage, str, bit)                        \
    if (stages & bit) {                                               \
        char head[DJG__CHAR_BUFFER_SIZE];                             \
        head[0] = '\0';                                               \
                                                                      \
        sprintf(head,                                                 \
                "#version %d %s\n",                                   \
                version,                                              \
                compatible ? "compatibility" : "");                   \
        strcat(head, "#define " str " 1\n");                          \
        srcv[0] = head;                                               \
        if (!djgp__attach_shader(glprogram, glstage, srcc, srcv)) {   \
            glDeleteProgram(glprogram);                               \
            DJG_FREE(srcv);                                           \
            return false;                                             \
        }                                                             \
    }
    DJGP__ATTACH_SHADER(GL_VERTEX_SHADER, "VERTEX_SHADER", DJGP__STAGE_VERTEX_BIT);
    DJGP__ATTACH_SHADER(GL_FRAGMENT_SHADER, "FRAGMENT_SHADER", DJGP__STAGE_FRAGMENT_BIT);
#if defined(GL_GEOMETRY_SHADER)
    DJGP__ATTACH_SHADER(GL_GEOMETRY_SHADER, "GEOMETRY_SHADER", DJGP__STAGE_GEOMETRY_BIT);
#endif
#if defined(GL_TESS_CONTROL_SHADER)
    DJGP__ATTACH_SHADER(GL_TESS_CONTROL_SHADER, "TESS_CONTROL_SHADER", DJGP__STAGE_TESS_CONTROL_BIT);
#endif
#if defined(GL_TESS_EVALUATION_SHADER)
    DJGP__ATTACH_SHADER(GL_TESS_EVALUATION_SHADER, "TESS_EVALUATION_SHADER", DJGP__STAGE_TESS_EVALUATION_BIT);
#endif
#if defined(GL_COMPUTE_SHADER)
    DJGP__ATTACH_SHADER(GL_COMPUTE_SHADER, "COMPUTE_SHADER", DJGP__STAGE_COMPUTE_BIT);
#endif
#if defined(GL_TASK_SHADER_NV)
    DJGP__ATTACH_SHADER(GL_TASK_SHADER_NV, "TASK_SHADER", DJGP__STAGE_TASK_BIT);
#endif
#if defined(GL_MESH_SHADER_NV)
    DJGP__ATTACH_SHADER(GL_MESH_SHADER_NV, "MESH_SHADER", DJGP__STAGE_MESH_BIT);
#endif

#undef DJGP__ATTACH_SHADER

    // link if requested
    if (link) {
        GLint link_status = 0;

        glLinkProgram(glprogram);
        glGetProgramiv(glprogram, GL_LINK_STATUS, &link_status);
        if (!link_status) {
            GLint logc = 0;
            GLchar *logv = NULL;

            glGetProgramiv(glprogram, GL_INFO_LOG_LENGTH, &logc);
            logv = (GLchar *)DJG_MALLOC(logc);
            glGetProgramInfoLog(glprogram, logc, NULL, logv);
            DJG_LOG("djg_error: GLSL linker failure\n\
                     -- Begin -- GLSL Linker Info Log\n\
                     %s\n\
                     -- End -- GLSL Linker Info Log\n", logv);
            glDeleteProgram(glprogram);
            DJG_FREE(logv);
            DJG_FREE(srcv);
            return false;
        }
    }

    // cleanup
    DJG_FREE(srcv);
    // affect program
    if (glIsProgram (*gl)) glDeleteProgram(*gl);
    *gl = glprogram;

    return true;
}